

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::copyValue(Value *this,Value *source)

{
  bool bVar1;
  uint8_t *__dest;
  uint8_t *__src;
  size_t __n;
  Value *source_local;
  Value *this_local;
  
  bVar1 = Type::isIdentical(&this->type,&source->type);
  if (!bVar1) {
    throwInternalCompilerError("copyValue",0x27b);
  }
  __dest = LazyAllocatedData::data(&this->allocatedData);
  __src = LazyAllocatedData::data(&source->allocatedData);
  __n = LazyAllocatedData::size(&this->allocatedData);
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

void Value::copyValue (const Value& source)
{
    if (type.isIdentical (source.type))
    {
        memcpy (allocatedData.data(), source.allocatedData.data(), allocatedData.size());
        return;
    }

    SOUL_ASSERT_FALSE;
}